

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Fts5ExprNode *
sqlite3Fts5ParseNode
          (Fts5Parse *pParse,int eType,Fts5ExprNode *pLeft,Fts5ExprNode *pRight,
          Fts5ExprNearset *pNear)

{
  bool bVar1;
  int iVar2;
  Fts5ExprNode *p;
  code *pcVar3;
  Fts5ExprPhrase *pFVar4;
  Fts5ExprPhrase *extraout_RAX;
  Fts5ExprPhrase *extraout_RAX_00;
  Fts5ExprPhrase *pFVar5;
  Fts5ExprNearset *pNear_1;
  char *pcVar6;
  
  if (pParse->rc != 0) {
    p = (Fts5ExprNode *)0x0;
    goto LAB_001cf70b;
  }
  if (eType == 9 && pNear == (Fts5ExprNearset *)0x0) {
    p = (Fts5ExprNode *)0x0;
    bVar1 = false;
    pFVar4 = (Fts5ExprPhrase *)0x0;
  }
  else if (eType == 9 || pLeft != (Fts5ExprNode *)0x0) {
    if (eType == 9 || pRight != (Fts5ExprNode *)0x0) {
      iVar2 = 2;
      if ((eType != 3) && (iVar2 = 0, eType - 1U < 2)) {
        iVar2 = 2;
        if (pLeft->eType == eType) {
          iVar2 = pLeft->nChild + 1;
        }
        if (pRight->eType == eType) {
          iVar2 = iVar2 + pRight->nChild + -1;
        }
      }
      p = (Fts5ExprNode *)sqlite3Fts5MallocZero(&pParse->rc,(long)iVar2 * 8 + 0x30);
      bVar1 = true;
      if (p == (Fts5ExprNode *)0x0) {
        p = (Fts5ExprNode *)0x0;
        pFVar4 = (Fts5ExprPhrase *)0x0;
      }
      else {
        p->eType = eType;
        p->pNear = pNear;
        if (eType == 1) {
          pcVar3 = fts5ExprNodeNext_OR;
        }
        else if (eType == 2) {
          pcVar3 = fts5ExprNodeNext_AND;
        }
        else if (eType == 9) {
          pcVar3 = fts5ExprNodeNext_STRING;
          if ((((pNear->nPhrase == 1) && (pFVar4 = pNear->apPhrase[0], pFVar4->nTerm == 1)) &&
              (pFVar4->aTerm[0].pSynonym == (Fts5ExprTerm *)0x0)) &&
             (pFVar4->aTerm[0].bFirst == '\0')) {
            p->eType = 4;
            pcVar3 = fts5ExprNodeNext_TERM;
          }
        }
        else {
          pcVar3 = fts5ExprNodeNext_NOT;
        }
        p->xNext = pcVar3;
        if (eType == 9) {
          iVar2 = pNear->nPhrase;
          pFVar4 = (Fts5ExprPhrase *)(long)iVar2;
          if (0 < (long)pFVar4) {
            pFVar5 = (Fts5ExprPhrase *)0x0;
            do {
              pNear->apPhrase[(long)pFVar5]->pNode = p;
              if (pNear->apPhrase[(long)pFVar5]->nTerm == 0) {
                p->xNext = (_func_int_Fts5Expr_ptr_Fts5ExprNode_ptr_int_i64 *)0x0;
                p->eType = 0;
              }
              pFVar5 = (Fts5ExprPhrase *)((long)&pFVar5->pNode + 1);
            } while (pFVar4 != pFVar5);
          }
          if (pParse->pConfig->eDetail != 0) {
            if (iVar2 == 1) {
              pFVar4 = pNear->apPhrase[0];
              pcVar6 = "phrase";
              iVar2 = (int)*(i64 *)&pFVar4->nTerm;
              if ((iVar2 < 2) && ((iVar2 != 1 || (pFVar4->aTerm[0].bFirst == '\0'))))
              goto LAB_001cf705;
            }
            else {
              pcVar6 = "NEAR";
            }
            pParse->rc = 1;
            pcVar6 = sqlite3_mprintf("fts5: %s queries are not supported (detail!=full)",pcVar6);
            pParse->zErr = pcVar6;
            sqlite3_free(p);
            p = (Fts5ExprNode *)0x0;
            pFVar4 = extraout_RAX_00;
          }
        }
        else {
          fts5ExprAddChildren(p,pLeft);
          fts5ExprAddChildren(p,pRight);
          pFVar4 = extraout_RAX;
        }
LAB_001cf705:
        bVar1 = true;
      }
    }
    else {
      p = (Fts5ExprNode *)0x0;
      bVar1 = false;
      pFVar4 = (Fts5ExprPhrase *)pLeft;
    }
  }
  else {
    p = (Fts5ExprNode *)0x0;
    bVar1 = false;
    pFVar4 = (Fts5ExprPhrase *)pRight;
  }
  if (!bVar1) {
    return (Fts5ExprNode *)pFVar4;
  }
LAB_001cf70b:
  if (p == (Fts5ExprNode *)0x0) {
    sqlite3Fts5ParseNodeFree(pLeft);
    sqlite3Fts5ParseNodeFree(pRight);
    sqlite3Fts5ParseNearsetFree(pNear);
  }
  return p;
}

Assistant:

static Fts5ExprNode *sqlite3Fts5ParseNode(
  Fts5Parse *pParse,              /* Parse context */
  int eType,                      /* FTS5_STRING, AND, OR or NOT */
  Fts5ExprNode *pLeft,            /* Left hand child expression */
  Fts5ExprNode *pRight,           /* Right hand child expression */
  Fts5ExprNearset *pNear          /* For STRING expressions, the near cluster */
){
  Fts5ExprNode *pRet = 0;

  if( pParse->rc==SQLITE_OK ){
    int nChild = 0;               /* Number of children of returned node */
    sqlite3_int64 nByte;          /* Bytes of space to allocate for this node */
 
    assert( (eType!=FTS5_STRING && !pNear)
         || (eType==FTS5_STRING && !pLeft && !pRight)
    );
    if( eType==FTS5_STRING && pNear==0 ) return 0;
    if( eType!=FTS5_STRING && pLeft==0 ) return pRight;
    if( eType!=FTS5_STRING && pRight==0 ) return pLeft;

    if( eType==FTS5_NOT ){
      nChild = 2;
    }else if( eType==FTS5_AND || eType==FTS5_OR ){
      nChild = 2;
      if( pLeft->eType==eType ) nChild += pLeft->nChild-1;
      if( pRight->eType==eType ) nChild += pRight->nChild-1;
    }

    nByte = sizeof(Fts5ExprNode) + sizeof(Fts5ExprNode*)*(nChild-1);
    pRet = (Fts5ExprNode*)sqlite3Fts5MallocZero(&pParse->rc, nByte);

    if( pRet ){
      pRet->eType = eType;
      pRet->pNear = pNear;
      fts5ExprAssignXNext(pRet);
      if( eType==FTS5_STRING ){
        int iPhrase;
        for(iPhrase=0; iPhrase<pNear->nPhrase; iPhrase++){
          pNear->apPhrase[iPhrase]->pNode = pRet;
          if( pNear->apPhrase[iPhrase]->nTerm==0 ){
            pRet->xNext = 0;
            pRet->eType = FTS5_EOF;
          }
        }

        if( pParse->pConfig->eDetail!=FTS5_DETAIL_FULL ){
          Fts5ExprPhrase *pPhrase = pNear->apPhrase[0];
          if( pNear->nPhrase!=1 
           || pPhrase->nTerm>1
           || (pPhrase->nTerm>0 && pPhrase->aTerm[0].bFirst)
          ){
            assert( pParse->rc==SQLITE_OK );
            pParse->rc = SQLITE_ERROR;
            assert( pParse->zErr==0 );
            pParse->zErr = sqlite3_mprintf(
                "fts5: %s queries are not supported (detail!=full)", 
                pNear->nPhrase==1 ? "phrase": "NEAR"
                );
            sqlite3_free(pRet);
            pRet = 0;
          }
        }
      }else{
        fts5ExprAddChildren(pRet, pLeft);
        fts5ExprAddChildren(pRet, pRight);
      }
    }
  }

  if( pRet==0 ){
    assert( pParse->rc!=SQLITE_OK );
    sqlite3Fts5ParseNodeFree(pLeft);
    sqlite3Fts5ParseNodeFree(pRight);
    sqlite3Fts5ParseNearsetFree(pNear);
  }
  return pRet;
}